

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O2

bool __thiscall
optimization::livevar_analyse::Livevar_Analyse::bfs_build(Livevar_Analyse *this,BasicBlk *start)

{
  BasicBlk *pBVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  int pre;
  value_type id;
  list<int,_std::allocator<int>_> queue;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  _Rb_tree_color local_80;
  key_type local_7c;
  _List_base<int,_std::allocator<int>_> local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_78._M_impl._M_node._M_size = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
  local_78._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::list<int,_std::allocator<int>_>::push_back
            ((list<int,_std::allocator<int>_> *)&local_78,&start->id);
  bVar6 = false;
  while (local_78._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_78) {
    local_7c = *(key_type *)&local_78._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,&local_7c);
    if (sVar3 == 0) {
      pmVar4 = std::
               map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
               ::at(&this->livevars,&local_7c);
      bVar2 = Block_Live_Var::build
                        ((pmVar4->
                         super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_7c);
      pmVar4 = std::
               map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
               ::at(&this->livevars,&local_7c);
      bVar6 = (bool)(bVar6 | bVar2);
      pBVar1 = ((pmVar4->
                super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->block;
      for (p_Var5 = *(_Base_ptr *)
                     ((long)&(pBVar1->preceding)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10
                     );
          (_Rb_tree_header *)p_Var5 != &(pBVar1->preceding)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        local_80 = p_Var5[1]._M_color;
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  ((list<int,_std::allocator<int>_> *)&local_78,(value_type_conflict3 *)&local_80);
      }
    }
    std::__cxx11::list<int,_std::allocator<int>_>::pop_front
              ((list<int,_std::allocator<int>_> *)&local_78);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear(&local_78);
  return bVar6;
}

Assistant:

bool bfs_build(mir::inst::BasicBlk& start) {
    std::list<mir::types::LabelId> queue;
    std::set<mir::types::LabelId> visited;
    queue.push_back(start.id);
    bool modify = false;
    while (!queue.empty()) {
      auto id = queue.front();
      if (!visited.count(id)) {
        modify |= livevars.at(id)->build();
        visited.insert(id);
        for (auto pre : livevars.at(id)->block.preceding) {
          queue.push_back(pre);
        }
      }
      queue.pop_front();
    }

    return modify;
  }